

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_outputter.hpp
# Opt level: O1

void hayai::Outputter::WriteTestNameToStream
               (ostream *stream,string *fixtureName,string *testName,
               TestParametersDescriptor *parameters)

{
  pointer pTVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(fixtureName->_M_dataplus)._M_p,fixtureName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(testName->_M_dataplus)._M_p,testName->_M_string_length);
  if ((parameters->_parameters).
      super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (parameters->_parameters).
      super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"(",1);
    if ((parameters->_parameters).
        super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (parameters->_parameters).
        super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar3 = 0x28;
      uVar4 = 0;
      do {
        if (uVar4 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
        }
        pTVar1 = (parameters->_parameters).
                 super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,*(char **)((long)pTVar1 + lVar3 + -0x28),
                            *(long *)((long)pTVar1 + lVar3 + -0x20));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,*(char **)((long)pTVar1 + lVar3 + -8),
                   *(long *)((long)&(pTVar1->Declaration)._M_dataplus + lVar3));
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x40;
      } while (uVar4 < (ulong)((long)(parameters->_parameters).
                                     super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(parameters->_parameters).
                                     super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 6));
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,")",1);
    return;
  }
  return;
}

Assistant:

static void WriteTestNameToStream(std::ostream& stream,
                                          const std::string& fixtureName,
                                          const std::string& testName,
                                          const TestParametersDescriptor&
                                              parameters)
        {
            stream << fixtureName << "." << testName;

            const std::vector<TestParameterDescriptor>& descs =
                parameters.Parameters();

            if (descs.empty())
                return;

            stream << "(";

            for (std::size_t i = 0; i < descs.size(); ++i)
            {
                if (i)
                    stream << ", ";

                const TestParameterDescriptor& desc = descs[i];
                stream << desc.Declaration << " = " << desc.Value;
            }

            stream << ")";
        }